

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall RM_FileHandle::SetBit(RM_FileHandle *this,char *bitmap,int size,int bitnum)

{
  int offset;
  int chunk;
  int bitnum_local;
  int size_local;
  char *bitmap_local;
  RM_FileHandle *this_local;
  
  if (size < bitnum) {
    this_local._4_4_ = 0x68;
  }
  else {
    bitmap[bitnum / 8] = bitmap[bitnum / 8] | (byte)(1 << ((byte)(bitnum % 8) & 0x1f));
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileHandle::SetBit(char *bitmap, int size, int bitnum){
  if (bitnum > size)
    return (RM_INVALIDBITOPERATION);
  int chunk = bitnum /8;
  int offset = bitnum - chunk*8;
  bitmap[chunk] |= 1 << offset;
  return (0);
}